

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_Ed25519.c
# Opt level: O2

_Bool Hacl_Impl_Ed25519_PointDecompress_point_decompress(uint64_t *out,uint8_t *s)

{
  uint64_t *output;
  byte bVar1;
  ulong uVar2;
  _Bool _Var3;
  ulong uVar4;
  ulong uVar5;
  uint64_t *x3;
  ulong uVar6;
  ulong uVar7;
  ulong local_288;
  ulong uStack_280;
  uint64_t local_278;
  uint64_t uStack_270;
  uint64_t local_268;
  uint64_t uStack_260;
  uint64_t local_258;
  uint64_t uStack_250;
  uint64_t local_248;
  uint64_t uStack_240;
  uint64_t local_238;
  undefined8 uStack_230;
  undefined8 local_228;
  undefined8 uStack_220;
  undefined8 local_218;
  uint local_210;
  undefined4 uStack_20c;
  uint64_t uStack_208;
  uint64_t local_200;
  uint64_t uStack_1f8;
  uint64_t local_1f0;
  undefined1 local_1e8 [16];
  undefined1 local_1d8 [16];
  undefined8 local_1c8;
  uint64_t local_1c0;
  undefined8 uStack_1b8;
  undefined8 local_1b0;
  undefined8 uStack_1a8;
  undefined8 local_1a0;
  uint64_t local_198 [10];
  uint64_t local_148 [5];
  uint64_t local_120 [5];
  uint64_t local_f8;
  undefined1 auStack_f0 [16];
  undefined1 auStack_e0 [16];
  uint64_t local_d0 [5];
  uint64_t local_a8 [5];
  uint64_t local_80;
  long lStack_78;
  long local_70;
  long lStack_68;
  long local_60;
  
  local_248 = 0;
  uStack_240 = 0;
  local_258 = 0;
  uStack_250 = 0;
  uStack_260 = 0;
  bVar1 = s[0x1f];
  uVar2 = *(ulong *)s;
  uVar4 = *(ulong *)(s + 6) >> 3 & 0x7ffffffffffff;
  uVar5 = *(ulong *)(s + 0xc) >> 6 & 0x7ffffffffffff;
  uVar6 = *(ulong *)(s + 0x13) >> 1 & 0x7ffffffffffff;
  uVar7 = *(ulong *)(s + 0x18) >> 0xc & 0x7ffffffffffff;
  local_288 = uVar2 & 0x7ffffffffffff;
  uStack_280 = uVar4;
  local_278 = uVar5;
  uStack_270 = uVar6;
  local_268 = uVar7;
  memset(&local_238,0,0xa0);
  if ((uVar7 != 0x7ffffffffffff ||
      (uVar6 != 0x7ffffffffffff || (uVar5 != 0x7ffffffffffff || uVar4 != 0x7ffffffffffff))) ||
      (uVar2 & 0x7ffffffffffff) < 0x7ffffffffffed) {
    memset(auStack_e0 + 8,0,0xa8);
    local_f8 = 1;
    auStack_f0 = (undefined1  [16])0x0;
    auStack_e0 = (undefined1  [16])0x0;
    Hacl_Bignum25519_fsquare(local_d0,&local_288);
    local_198[0] = 0x34dca135978a3;
    local_198[1] = 0x1a8283b156ebd;
    local_198[2] = 0x5e7a26001c029;
    local_198[3] = 0x739c663a03cbb;
    local_198[4] = 0x52036cee2b6ff;
    Hacl_Bignum_Fmul_fmul(&local_80,local_198,local_d0);
    local_80 = local_80 + local_f8;
    lStack_78 = lStack_78 + auStack_f0._0_8_;
    local_70 = local_70 + auStack_f0._8_8_;
    lStack_68 = lStack_68 + auStack_e0._0_8_;
    local_60 = local_60 + auStack_e0._8_8_;
    Hacl_Bignum25519_reduce_513(&local_80);
    Hacl_Bignum25519_inverse(local_a8,&local_80);
    Hacl_Bignum25519_fdifference(&local_f8,local_d0);
    Hacl_Bignum_Fmul_fmul(&local_238,local_a8,&local_f8);
    Hacl_Bignum25519_reduce(&local_238);
    _Var3 = Hacl_Impl_Ed25519_RecoverX_is_0(&local_238);
    if (_Var3) {
      if (-1 < (char)bVar1) {
        uStack_250 = 0;
        local_248 = 0;
        uStack_260 = 0;
        local_258 = 0;
        uStack_240 = 0;
LAB_00108cd1:
        out[4] = uStack_240;
        out[2] = uStack_250;
        out[3] = local_248;
        *out = uStack_260;
        out[1] = local_258;
        out[5] = local_288;
        out[6] = uStack_280;
        out[7] = local_278;
        out[8] = uStack_270;
        out[9] = local_268;
        out[10] = 1;
        *(undefined1 (*) [16])(out + 0xb) = (undefined1  [16])0x0;
        *(undefined1 (*) [16])(out + 0xd) = (undefined1  [16])0x0;
        Hacl_Bignum_Fmul_fmul(out + 0xf,&uStack_260,&local_288);
        return true;
      }
    }
    else {
      memset(local_198,0,0xa0);
      output = local_198 + 5;
      Hacl_Bignum_Fsquare_fsquare_times(local_198,&local_238,1);
      Hacl_Bignum_Fsquare_fsquare_times(output,local_198,2);
      Hacl_Bignum_Fmul_fmul(local_148,output,&local_238);
      Hacl_Bignum_Fmul_fmul(local_198,local_148,local_198);
      Hacl_Bignum_Fsquare_fsquare_times(output,local_198,1);
      Hacl_Bignum_Fmul_fmul(local_148,output,local_148);
      Hacl_Bignum_Fsquare_fsquare_times(output,local_148,5);
      Hacl_Bignum_Fmul_fmul(local_148,output,local_148);
      Hacl_Bignum_Fsquare_fsquare_times(output,local_148,10);
      Hacl_Bignum_Fmul_fmul(local_120,output,local_148);
      Hacl_Bignum_Fsquare_fsquare_times(output,local_120,0x14);
      Hacl_Bignum_Fmul_fmul(output,output,local_120);
      Hacl_Bignum_Fsquare_fsquare_times_inplace(output,10);
      Hacl_Bignum_Fmul_fmul(local_148,output,local_148);
      Hacl_Bignum_Fsquare_fsquare_times(output,local_148,0x32);
      Hacl_Bignum_Fsquare_fsquare_times(local_198,&local_238,1);
      Hacl_Bignum_Fmul_fmul(local_120,output,local_148);
      Hacl_Bignum_Fsquare_fsquare_times(output,local_120,100);
      Hacl_Bignum_Fmul_fmul(output,output,local_120);
      Hacl_Bignum_Fsquare_fsquare_times_inplace(output,0x32);
      Hacl_Bignum_Fmul_fmul(output,output,local_148);
      Hacl_Bignum_Fsquare_fsquare_times_inplace(output,2);
      Hacl_Bignum_Fmul_fmul((uint64_t *)&local_210,output,local_198);
      Hacl_Bignum25519_fsquare((uint64_t *)local_1e8,(uint64_t *)&local_210);
      local_1a0 = local_218;
      local_1b0 = local_228;
      uStack_1a8 = uStack_220;
      local_1c0 = local_238;
      uStack_1b8 = uStack_230;
      Hacl_Bignum25519_fdifference(&local_1c0,(uint64_t *)local_1e8);
      Hacl_Bignum25519_reduce_513(&local_1c0);
      Hacl_Bignum25519_reduce(&local_1c0);
      _Var3 = Hacl_Impl_Ed25519_RecoverX_is_0(&local_1c0);
      if (!_Var3) {
        local_198[0] = 0x61b274a0ea0b0;
        local_198[1] = 0xd5a5fc8f189d;
        local_198[2] = 0x7ef5e9cbd0c60;
        local_198[3] = 0x78595a6804c9e;
        local_198[4] = 0x2b8324804fc1d;
        Hacl_Bignum_Fmul_fmul((uint64_t *)&local_210,(uint64_t *)&local_210,local_198);
      }
      Hacl_Bignum25519_reduce((uint64_t *)&local_210);
      Hacl_Bignum25519_fsquare((uint64_t *)local_1e8,(uint64_t *)&local_210);
      local_1a0 = local_218;
      local_1b0 = local_228;
      uStack_1a8 = uStack_220;
      local_1c0 = local_238;
      uStack_1b8 = uStack_230;
      Hacl_Bignum25519_fdifference(&local_1c0,(uint64_t *)local_1e8);
      Hacl_Bignum25519_reduce_513(&local_1c0);
      Hacl_Bignum25519_reduce(&local_1c0);
      _Var3 = Hacl_Impl_Ed25519_RecoverX_is_0(&local_1c0);
      if (_Var3) {
        if ((local_210 & 1) != (uint)(bVar1 >> 7)) {
          local_1d8 = (undefined1  [16])0x0;
          local_1e8 = (undefined1  [16])0x0;
          local_1c8 = 0;
          Hacl_Bignum25519_fdifference((uint64_t *)&local_210,(uint64_t *)local_1e8);
          Hacl_Bignum25519_reduce_513((uint64_t *)&local_210);
          Hacl_Bignum25519_reduce((uint64_t *)&local_210);
        }
        uStack_240 = local_1f0;
        uStack_260 = CONCAT44(uStack_20c,local_210);
        uStack_250 = local_200;
        local_248 = uStack_1f8;
        local_258 = uStack_208;
        goto LAB_00108cd1;
      }
    }
  }
  return false;
}

Assistant:

static bool Hacl_Impl_Ed25519_PointDecompress_point_decompress(uint64_t *out, uint8_t *s)
{
  uint64_t tmp[10U] = { 0U };
  uint64_t *y0 = tmp;
  uint64_t *x0 = tmp + (uint32_t)5U;
  uint64_t *y = tmp;
  uint64_t *x = tmp + (uint32_t)5U;
  uint8_t s31 = s[31U];
  uint64_t sign1 = (uint64_t)(s31 >> (uint32_t)7U);
  Hacl_Impl_Load51_load_51(y, s);
  bool z = Hacl_Impl_Ed25519_RecoverX_recover_x(x, y, sign1);
  bool z0 = z;
  bool res;
  if (z0 == false)
    res = false;
  else
  {
    uint64_t *outx = Hacl_Impl_Ed25519_ExtPoint_getx(out);
    uint64_t *outy = Hacl_Impl_Ed25519_ExtPoint_gety(out);
    uint64_t *outz = Hacl_Impl_Ed25519_ExtPoint_getz(out);
    uint64_t *outt = Hacl_Impl_Ed25519_ExtPoint_gett(out);
    memcpy(outx, x0, (uint32_t)5U * sizeof x0[0U]);
    memcpy(outy, y0, (uint32_t)5U * sizeof y0[0U]);
    uint64_t zero1 = (uint64_t)0U;
    uint64_t one1 = (uint64_t)1U;
    Hacl_Lib_Create64_make_h64_5(outz, one1, zero1, zero1, zero1, zero1);
    Hacl_Bignum25519_fmul(outt, x0, y0);
    res = true;
  }
  return res;
}